

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trick.cpp
# Opt level: O1

void __thiscall Trick::print_trick(Trick *this)

{
  ostream *poVar1;
  Card *pCVar2;
  Card card;
  Card local_58;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Printing trick....",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  pCVar2 = (Card *)(this->m_trick_pile).
                   super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar2 != (Card *)(this->m_trick_pile).
                        super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_58 = *pCVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card is ",8);
      Card::Card2Str_abi_cxx11_(&local_50,&local_58);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pCVar2 = (Card *)&pCVar2[1].m_rank;
    } while (pCVar2 != (Card *)(this->m_trick_pile).
                               super__Vector_base<std::tuple<int,_Card>,_std::allocator<std::tuple<int,_Card>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"....",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  return;
}

Assistant:

void Trick::print_trick()
{
    std::cout << "Printing trick...." << std::endl;
    for(std::vector<player_move>::iterator it = m_trick_pile.begin(); it != m_trick_pile.end(); ++it) {
        Card card = std::get<1>(*it);
        std::cout << "Card is " << card.Card2Str() << std::endl;
    }
    std::cout << "...." << std::endl;
}